

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_sse3.c
# Opt level: O0

void nn_propagate_8to1(float *inputs,float *weights,float *bias,int num_inputs_to_process,
                      int tot_num_inputs,int num_outputs,float *output_nodes,int is_clip_required)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  __m128 sum_par_1;
  __m128 sum_par_0;
  __m128 high_128;
  __m128 low_128;
  __m256 mul0;
  __m256 weight0;
  int weight_idx;
  __m256 inputs256;
  int in;
  float bias_val;
  __m256 in_result;
  int out;
  undefined4 local_2d4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1a8;
  undefined4 local_170;
  undefined4 local_160;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  
  for (local_1a8 = 0; local_1a8 < in_R9D; local_1a8 = local_1a8 + 1) {
    uStack_1d0 = 0.0;
    uStack_1cc = 0.0;
    uStack_1c8 = 0.0;
    uStack_1c4 = 0.0;
    for (local_1e8 = 0; local_1e8 < in_ECX; local_1e8 = local_1e8 + 8) {
      lVar6 = in_RDI + (long)local_1e8 * 4;
      uVar3 = *(undefined8 *)(lVar6 + 0x10);
      uVar4 = *(undefined8 *)(lVar6 + 0x18);
      lVar6 = in_RSI + (long)(local_1e8 + local_1a8 * in_R8D) * 4;
      uVar5 = *(undefined8 *)(lVar6 + 0x10);
      uStack_d0 = (float)uVar3;
      uStack_cc = (float)((ulong)uVar3 >> 0x20);
      uStack_c8 = (float)uVar4;
      uStack_c4 = (float)((ulong)uVar4 >> 0x20);
      uStack_f0 = (float)uVar5;
      uStack_ec = (float)((ulong)uVar5 >> 0x20);
      uStack_e8 = (float)*(undefined8 *)(lVar6 + 0x18);
      uStack_1d0 = uStack_1d0 + uStack_d0 * uStack_f0;
      uStack_1cc = uStack_1cc + uStack_cc * uStack_ec;
      uStack_1c8 = uStack_1c8 + uStack_c8 * uStack_e8;
      uStack_1c4 = uStack_1c4 + uStack_c4;
    }
    local_150 = (float)local_2a0;
    uStack_14c = (float)((ulong)local_2a0 >> 0x20);
    uStack_148 = (float)uStack_298;
    uStack_144 = (float)((ulong)uStack_298 >> 0x20);
    uVar3 = CONCAT44(uStack_1cc + uStack_14c,uStack_1d0 + local_150);
    uVar4 = CONCAT44(uStack_1c4 + uStack_144,uStack_1c8 + uStack_148);
    auVar2._8_8_ = uVar4;
    auVar2._0_8_ = uVar3;
    auVar1._8_8_ = uVar4;
    auVar1._0_8_ = uVar3;
    auVar1 = vhaddps_avx(auVar2,auVar1);
    auVar2 = vpermilps_avx(auVar1,0x99);
    local_160 = auVar2._0_4_;
    local_170 = auVar1._0_4_;
    local_2d4 = local_160 + local_170 + *(float *)(in_RDX + (long)local_1a8 * 4);
    local_1e4 = local_2d4;
    if ((int)output_nodes != 0) {
      if (local_2d4 <= 0.0) {
        local_2d4 = 0.0;
      }
      local_1e4 = local_2d4;
    }
    *(float *)(in_stack_00000008 + (long)local_1a8 * 4) = local_1e4;
  }
  return;
}

Assistant:

static void nn_propagate_8to1(const float *const inputs,
                              const float *const weights,
                              __m128 *const output) {
  const __m128 inputs_h = _mm_loadu_ps(&inputs[4]);
  const __m128 inputs_l = _mm_loadu_ps(inputs);

  const __m128 weights_h = _mm_loadu_ps(&weights[4]);
  const __m128 weights_l = _mm_loadu_ps(weights);

  const __m128 mul_h = _mm_mul_ps(inputs_h, weights_h);
  const __m128 mul_l = _mm_mul_ps(inputs_l, weights_l);
  // [7 6 5 4] [3 2 1 0] (weight and input indices)

  const __m128 vadd = _mm_add_ps(mul_l, mul_h);
  // [7+3 6+2 5+1 4+0]
  const __m128 hadd1 = _mm_hadd_ps(vadd, vadd);
  // [7+6+3+2 5+4+1+0 7+6+3+2 5+4+1+0]
  const __m128 hadd2 = _mm_hadd_ps(hadd1, hadd1);
  // [7+6+5+4+3+2+1+0 7+6+5+4+3+2+1+0 7+6+5+4+3+2+1+0 7+6+5+4+3+2+1+0]
  *output = _mm_add_ps(*output, hadd2);
}